

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O1

ByteCodeUsesInstr * __thiscall GlobOpt::ConvertToByteCodeUses(GlobOpt *this,Instr *instr)

{
  BVSparse<Memory::JitArenaAllocator> *pBVar1;
  Type pJVar2;
  Type pBVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  ByteCodeUsesInstr *this_00;
  Type_conflict pBVar7;
  Type_conflict pBVar8;
  PropertySym *local_28;
  PropertySym *propertySymUseBefore;
  
  local_28 = (PropertySym *)0x0;
  if (this->byteCodeUses != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x4a1,"(this->byteCodeUses == nullptr)","this->byteCodeUses == nullptr");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar6 = 0;
  }
  pBVar1 = this->byteCodeUsesBeforeOpt;
  if (pBVar1->head != (Type_conflict)0x0) {
    pJVar2 = pBVar1->alloc;
    pBVar3 = pBVar1->head;
    pBVar8 = pJVar2->bvFreeList;
    do {
      pBVar7 = pBVar3;
      pBVar3 = pBVar7->next;
      pBVar7->next = pBVar8;
      pBVar8 = pBVar7;
    } while (pBVar3 != (Type)0x0);
    pJVar2->bvFreeList = pBVar7;
  }
  pBVar1->head = (Type_conflict)0x0;
  pBVar1->lastFoundIndex = (Type_conflict)0x0;
  pBVar1->lastUsedNodePrevNextField = &pBVar1->head;
  TrackByteCodeSymUsed(instr,this->byteCodeUsesBeforeOpt,&local_28);
  CaptureByteCodeSymUses(this,instr);
  this_00 = InsertByteCodeUses(this,instr,true);
  IR::Instr::Remove(instr);
  if (this_00 != (ByteCodeUsesInstr *)0x0) {
    IR::ByteCodeUsesInstr::AggregateFollowingByteCodeUses(this_00);
  }
  return this_00;
}

Assistant:

IR::ByteCodeUsesInstr *
GlobOpt::ConvertToByteCodeUses(IR::Instr * instr)
{
#if DBG
    PropertySym *propertySymUseBefore = NULL;
    Assert(this->byteCodeUses == nullptr);
    this->byteCodeUsesBeforeOpt->ClearAll();
    GlobOpt::TrackByteCodeSymUsed(instr, this->byteCodeUsesBeforeOpt, &propertySymUseBefore);
#endif
    this->CaptureByteCodeSymUses(instr);
    IR::ByteCodeUsesInstr * byteCodeUsesInstr = this->InsertByteCodeUses(instr, true);
    instr->Remove();
    if (byteCodeUsesInstr)
    {
        byteCodeUsesInstr->AggregateFollowingByteCodeUses();
    }
    return byteCodeUsesInstr;
}